

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

void __thiscall
duckdb::WindowBoundariesState::PartitionBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask)

{
  data_ptr_t __s;
  unsigned_long *puVar1;
  reference pvVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t n;
  idx_t local_38;
  
  pvVar2 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
  __s = pvVar2->data;
  if (this->partition_count + this->order_count == 0) {
    if (count != 0) {
      switchD_012e5a64::default(__s,0,count << 3);
      return;
    }
  }
  else if (count != 0) {
    puVar1 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar4 = 0;
    do {
      if ((puVar1[row_idx >> 6] >> (row_idx & 0x3f) & 1) == 0) {
        if ((is_jump & 1U) != 0) goto LAB_01197073;
        iVar3 = this->partition_start;
      }
      else if ((is_jump & 1U) == 0) {
        this->partition_start = row_idx;
        iVar3 = row_idx;
      }
      else {
LAB_01197073:
        local_38 = 1;
        iVar3 = FindPrevStart(partition_mask,0,row_idx + 1,&local_38);
        is_jump = false;
        this->partition_start = iVar3;
      }
      *(idx_t *)(__s + iVar4 * 8) = iVar3;
      iVar4 = iVar4 + 1;
      row_idx = row_idx + 1;
    } while (count != iVar4);
  }
  return;
}

Assistant:

void WindowBoundariesState::PartitionBegin(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                           const ValidityMask &partition_mask) {
	auto partition_begin_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_BEGIN]);

	//	OVER()
	if (partition_count + order_count == 0) {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			partition_begin_data[chunk_idx] = 0;
		}
		return;
	}

	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		// determine partition and peer group boundaries to ultimately figure out window size
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);

		// when the partition changes, recompute the boundaries
		if (!is_same_partition || is_jump) {
			if (is_jump) {
				idx_t n = 1;
				partition_start = FindPrevStart(partition_mask, 0, row_idx + 1, n);
				is_jump = false;
			} else {
				partition_start = row_idx;
			}
		}

		partition_begin_data[chunk_idx] = partition_start;
	}
}